

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,BinaryExpression *bin_exp,void *data)

{
  pointer pSVar1;
  size_t sVar2;
  Instruction *this_00;
  int *in_RDX;
  String *in_RSI;
  function<void_()> *in_RDI;
  Instruction instruction;
  OpType op_type;
  ExpVarData_conflict exp_var_data_3;
  Guard g;
  int r;
  ExpVarData_conflict exp_var_data_2;
  int right_register;
  ExpVarData_conflict exp_var_data_1;
  int left_register;
  int dst_index;
  ExpVarData_conflict right_data;
  int index;
  Instruction instruction_1;
  OpType op_type_1;
  ExpVarData_conflict left_data;
  int token;
  int line;
  Function *function;
  int end_register;
  int register_id;
  ExpVarData_conflict *exp_var_data;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  OpType in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  Function *in_stack_fffffffffffffed8;
  function<void_()> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 local_104 [4];
  CodeGenerateVisitor *in_stack_ffffffffffffff00;
  function<void_()> local_e0;
  undefined1 local_b8 [76];
  int local_6c;
  ExpVarData local_68;
  undefined4 local_5c;
  ExpVarData local_58;
  undefined4 local_4c;
  uint local_48;
  undefined4 local_44;
  ExpVarData local_40;
  uint local_34;
  Function *local_30;
  int local_28;
  int local_24;
  String *local_10;
  
  local_24 = *in_RDX;
  local_28 = in_RDX[1];
  if ((local_28 == -1) || (local_24 < local_28)) {
    local_10 = in_RSI;
    local_30 = GetCurrentFunction((CodeGenerateVisitor *)in_RDI);
    local_34 = local_10->length_;
    local_40._8_4_ = SUB84(local_10->hash_,0);
    if ((local_40._8_4_ == 0x100) || (local_40._8_4_ == 0x10e)) {
      ExpVarData::ExpVarData(&local_40,local_24,local_24 + 1);
      pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                         ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                          0x20b8b1);
      (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_40);
      local_44 = 0x10;
      if (local_40._8_4_ == 0x100) {
        local_44 = 0xf;
      }
      local_58._8_4_ =
           Instruction::AsBxCode
                     (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
      ;
      local_48 = local_58._8_4_;
      sVar2 = Function::AddInstruction
                        (in_stack_fffffffffffffed8,
                         (Instruction)(uint)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         in_stack_fffffffffffffed4);
      local_4c = (undefined4)sVar2;
      ExpVarData::ExpVarData(&local_58,local_24,local_24 + 1);
      pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                         ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                          0x20b963);
      (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_58);
      sVar2 = Function::OpCodeSize((Function *)0x20b986);
      local_5c = (undefined4)sVar2;
      this_00 = Function::GetMutableInstruction
                          ((Function *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                           ,CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      Instruction::RefillsBx(this_00,(short)local_5c - (short)local_4c);
      FillRemainRegisterNil
                ((CodeGenerateVisitor *)in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed4);
    }
    else {
      local_68.results_any_count_ = false;
      local_68._9_3_ = 0;
      ExpVarData::ExpVarData(&local_68,local_24,local_24 + 1);
      pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                         ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                          0x20ba1c);
      (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_68);
      local_68._8_4_ = local_24;
      local_6c = 0;
      if ((local_28 == -1) || (local_28 <= local_24 + 1)) {
        local_b8._64_4_ = GetNextRegisterId((CodeGenerateVisitor *)in_RDI);
        in_stack_fffffffffffffed8 = (Function *)local_b8;
        std::function<void()>::
        function<luna::CodeGenerateVisitor::Visit(luna::BinaryExpression*,void*)::__0,void>
                  (in_stack_fffffffffffffee0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffed8);
        in_stack_fffffffffffffee0 = &local_e0;
        std::function<void()>::
        function<luna::CodeGenerateVisitor::Visit(luna::BinaryExpression*,void*)::__1,void>
                  (in_stack_fffffffffffffee0,(anon_class_16_2_fd512ddf *)in_stack_fffffffffffffed8);
        Guard::Guard((Guard *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_RDI,
                     in_stack_fffffffffffffee0);
        std::function<void_()>::~function((function<void_()> *)0x20bb3a);
        std::function<void_()>::~function((function<void_()> *)0x20bb47);
        in_stack_fffffffffffffed4 = GenerateRegisterId(in_stack_ffffffffffffff00);
        local_6c = in_stack_fffffffffffffed4;
        ExpVarData::ExpVarData
                  ((ExpVarData *)local_104,in_stack_fffffffffffffed4,in_stack_fffffffffffffed4 + 1);
        pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::
                 operator->((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                            0x20bb8a);
        (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_104);
        Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      }
      else {
        ExpVarData::ExpVarData((ExpVarData *)(local_b8 + 0x44),local_24 + 1,local_24 + 2);
        pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::
                 operator->((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                            0x20ba9a);
        (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_b8 + 0x44);
        local_6c = local_24 + 1;
      }
      if (((((local_40._8_4_ != OpType_GetTable) &&
            (local_40._8_4_ != (OpType_UnEqual|OpType_SetGlobal))) &&
           (local_40._8_4_ != (OpType_UnEqual|OpType_Closure))) &&
          (((local_40._8_4_ != (OpType_UnEqual|OpType_VarArg) &&
            (local_40._8_4_ != (OpType_UnEqual|OpType_JmpFalse))) &&
           ((local_40._8_4_ != (OpType_UnEqual|OpType_Concat) &&
            ((local_40._8_4_ != (OpType_UnEqual|OpType_Greater) && (local_40._8_4_ != 0x5e))))))))
         && ((local_40._8_4_ != 0x118 &&
             ((((local_40._8_4_ != 0x119 && (local_40._8_4_ != 0x11a)) && (local_40._8_4_ != 0x11b))
              && (local_40._8_4_ != 0x11c)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x572,
                      "virtual void luna::CodeGenerateVisitor::Visit(BinaryExpression *, void *)");
      }
      local_24 = local_24 + 1;
      Instruction::ABCCode(local_40._8_4_,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,0);
      Function::AddInstruction
                (in_stack_fffffffffffffed8,
                 (Instruction)(uint)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                 in_stack_fffffffffffffed4);
      FillRemainRegisterNil
                ((CodeGenerateVisitor *)in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed4);
    }
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(BinaryExpression *bin_exp, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;

        if (end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        auto function = GetCurrentFunction();
        auto line = bin_exp->op_token_.line_;
        auto token = bin_exp->op_token_.token_;
        if (token == Token_And || token == Token_Or)
        {
            // Calculate left expression
            ExpVarData left_data{ register_id, register_id + 1 };
            bin_exp->left_->Accept(this, &left_data);

            // Do not calculate right expression when the result of left expression
            // satisfy semantics of operator
            auto op_type = token == Token_And ? OpType_JmpFalse : OpType_JmpTrue;
            auto instruction = Instruction::AsBxCode(op_type, register_id, 0);
            int index = function->AddInstruction(instruction, line);

            // Calculate right expression
            ExpVarData right_data{ register_id, register_id + 1 };
            bin_exp->right_->Accept(this, &right_data);

            int dst_index = function->OpCodeSize();
            function->GetMutableInstruction(index)->RefillsBx(dst_index - index);

            return FillRemainRegisterNil(register_id + 1, end_register, line);
        }

        int left_register = 0;
        // Generate code to calculate left expression
        {
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            bin_exp->left_->Accept(this, &exp_var_data);
            left_register = register_id;
        }

        int right_register = 0;
        // Generate code to calculate right expression
        {
            if (end_register != EXP_VALUE_COUNT_ANY && register_id + 1 < end_register)
            {
                // If parent AST provide more than one register, then use the second
                // register as temp register of right expression
                ExpVarData exp_var_data{ register_id + 1, register_id + 2 };
                bin_exp->right_->Accept(this, &exp_var_data);
                right_register = register_id + 1;
            }
            else
            {
                // No more register, then generate a new register as temp register of
                // right expression
                REGISTER_GENERATOR_GUARD();
                right_register = GenerateRegisterId();
                ExpVarData exp_var_data{ right_register, right_register + 1 };
                bin_exp->right_->Accept(this, &exp_var_data);
            }
        }

        // Choose OpType by operator
        OpType op_type;
        switch (token) {
            case '+': op_type = OpType_Add; break;
            case '-': op_type = OpType_Sub; break;
            case '*': op_type = OpType_Mul; break;
            case '/': op_type = OpType_Div; break;
            case '^': op_type = OpType_Pow; break;
            case '%': op_type = OpType_Mod; break;
            case '<': op_type = OpType_Less; break;
            case '>': op_type = OpType_Greater; break;
            case Token_Concat: op_type = OpType_Concat; break;
            case Token_Equal: op_type = OpType_Equal; break;
            case Token_NotEqual: op_type = OpType_UnEqual; break;
            case Token_LessEqual: op_type = OpType_LessEqual; break;
            case Token_GreaterEqual: op_type = OpType_GreaterEqual; break;
            default: assert(0); break;
        }

        // Generate instruction to calculate
        auto instruction = Instruction::ABCCode(op_type, register_id++,
                                                left_register, right_register);
        function->AddInstruction(instruction, line);

        FillRemainRegisterNil(register_id, end_register, line);
    }